

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

void senjo::BackgroundCommand::Run(void *data)

{
  exception *e;
  Output local_20;
  long *local_18;
  BackgroundCommand *cmd;
  void *data_local;
  
  local_18 = (long *)0x0;
  cmd = (BackgroundCommand *)data;
  if (data == (void *)0x0) {
    Output::Output(&local_20,InfoPrefix);
    Output::operator<<(&local_20,(char (*) [45])"BackgroundCommand::Run() NULL data parameter");
    Output::~Output(&local_20);
  }
  else {
    local_18 = (long *)data;
    if (data == (void *)0x0) {
      Output::Output((Output *)&e,InfoPrefix);
      Output::operator<<((Output *)&e,
                         (char (*) [55])"BackgroundCommand::Run() failed to cast data parameter");
      Output::~Output((Output *)&e);
    }
    else {
      (**(code **)(*data + 0x30))();
      if ((local_18 != (long *)0x0) && (local_18 != (long *)0x0)) {
        (**(code **)(*local_18 + 8))();
      }
    }
  }
  return;
}

Assistant:

void BackgroundCommand::Run(void* data)
{
  BackgroundCommand* cmd = NULL;
  try {
    if (!data) {
      Output() << "BackgroundCommand::Run() NULL data parameter";
      return;
    }

#ifdef NDEBUG
    cmd = static_cast<BackgroundCommand*>(data);
#else
    cmd = reinterpret_cast<BackgroundCommand*>(data);
    if (!cmd) {
      // NOTE: potential memory leak if this happens
      Output() << "BackgroundCommand::Run() failed to cast data parameter";
      return;
    }
#endif

    cmd->Execute();
  }
  catch (const std::exception& e) {
    std::cerr << "BackgrounThread::Run() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "BackgrounThread::Run() ERROR: unknown exception"
              << std::endl;
  }

  if (cmd) {
    delete cmd;
    cmd = NULL;
  }
}